

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall
gimage::BasicImageIO::loadHeader(BasicImageIO *this,char *name,long *width,long *height,int *depth)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  allocator *__lhs;
  allocator local_89;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  IOException *in_stack_ffffffffffffff90;
  
  uVar1 = __cxa_allocate_exception(0x28);
  __lhs = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,(char *)in_RSI,__lhs);
  std::operator+((char *)__lhs,in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RSI);
  gutil::IOException::IOException(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void BasicImageIO::loadHeader(const char *name, long &width, long &height,
                              int &depth) const
{
  throw gutil::IOException("Loading the header of this image type is not implemented!"+std::string(
                             name)+")");
}